

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::ParseContext::ParseMessage<google::protobuf::MessageLite>
          (ParseContext *this,MessageLite *msg,char *ptr)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  undefined4 extraout_var;
  uint uVar6;
  char *local_28;
  
  local_28 = ptr;
  uVar4 = ReadSize(&local_28);
  if (local_28 != (char *)0x0) {
    pcVar2 = (this->super_EpsCopyInputStream).buffer_end_;
    uVar6 = uVar4 + ((int)local_28 - (int)pcVar2);
    (this->super_EpsCopyInputStream).limit_end_ = pcVar2 + (int)((int)uVar6 >> 0x1f & uVar6);
    iVar1 = (this->super_EpsCopyInputStream).limit_;
    (this->super_EpsCopyInputStream).limit_ = uVar6;
    iVar5 = this->depth_;
    this->depth_ = iVar5 + -1;
    if (0 < iVar5) {
      iVar5 = (*msg->_vptr_MessageLite[0xd])(msg,local_28,this);
      local_28 = (char *)CONCAT44(extraout_var,iVar5);
      if (local_28 != (char *)0x0) {
        this->depth_ = this->depth_ + 1;
        bVar3 = EpsCopyInputStream::PopLimit(&this->super_EpsCopyInputStream,iVar1 - uVar6);
        if (bVar3) {
          return local_28;
        }
      }
    }
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* ParseContext::ParseMessage(
    T* msg, const char* ptr) {
  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;
  auto old = PushLimit(ptr, size);
  if (--depth_ < 0) return nullptr;
  ptr = msg->_InternalParse(ptr, this);
  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
  depth_++;
  if (!PopLimit(old)) return nullptr;
  return ptr;
}